

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicScalableKReach.cpp
# Opt level: O2

bool __thiscall
DynamicScalableKReach::DynamicPartialIndex::double_intermediate
          (DynamicPartialIndex *this,vertex_t s,vertex_t t)

{
  __node_base *p_Var1;
  byte bVar2;
  byte bVar3;
  __node_base *p_Var4;
  mapped_type *pmVar5;
  byte *pbVar6;
  __node_base *p_Var7;
  Index *__range2;
  
  p_Var1 = &(this->succ_)._M_h._M_before_begin;
  p_Var4 = p_Var1;
  while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
    p_Var7 = p_Var1;
    while (p_Var7 = p_Var7->_M_nxt, p_Var7 != (__node_base *)0x0) {
      pmVar5 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)&this->pred_,(key_type *)(p_Var4 + 1));
      pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(pmVar5,(ulong)s);
      bVar2 = *pbVar6;
      pmVar5 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)&this->succ_,(key_type *)(p_Var4 + 1));
      pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                         (pmVar5,(ulong)(uint)*(size_type *)(p_Var7 + 1));
      bVar3 = *pbVar6;
      pmVar5 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)&this->succ_,(key_type *)(p_Var7 + 1));
      pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(pmVar5,(ulong)t);
      if ((uint)*pbVar6 + (uint)bVar2 + (uint)bVar3 <= (uint)this->k_) goto LAB_0010a75a;
    }
  }
LAB_0010a75a:
  return p_Var4 != (__node_base *)0x0;
}

Assistant:

bool DynamicScalableKReach::DynamicPartialIndex::double_intermediate(vertex_t s, vertex_t t) const {
    for (const auto &i : succ_) {
        for (const auto &j : succ_) {
            if (pred_.at(i.first).at(s) + succ_.at(i.first).at(j.first) + succ_.at(j.first).at(t) <= k_) {
                return true;
            }
        }
    }
    return false;
}